

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hvtool.cpp
# Opt level: O2

size_t readutf16le<MemoryReader*>(MemoryReader *rd,Wstring *v,size_t n)

{
  uint uVar1;
  undefined4 extraout_var;
  size_t __n;
  undefined8 *puVar2;
  
  std::__cxx11::
  basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>::
  resize(v,n);
  uVar1 = (*(rd->super_ReadWriter)._vptr_ReadWriter[2])(rd,(v->_M_dataplus)._M_p,n * 2);
  if ((uVar1 & 1) == 0) {
    std::__cxx11::
    basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
    ::resize(v,CONCAT44(extraout_var,uVar1) >> 1);
    __n = stringlength<unsigned_short>((v->_M_dataplus)._M_p);
    std::__cxx11::
    basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
    ::resize(v,__n);
    return v->_M_string_length;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = "read partial uint16_t";
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

size_t readutf16le(PTR rd, std::Wstring& v, size_t n)
{
    v.resize(n);
    size_t nr= rd->read((uint8_t*)&v[0], n*sizeof(uint16_t));
    if (nr%sizeof(uint16_t))
        throw "read partial uint16_t";
    v.resize(nr/sizeof(uint16_t));
    v.resize(stringlength(&v[0]));
#if __BYTE_ORDER == __BIG_ENDIAN
#ifdef __GXX_EXPERIMENTAL_CXX0X__
    std::for_each(v.begin(), v.end(), [](uint16_t& x) { x= swab16(x);});
#else
    throw "need c++0x";
#endif
#endif

    return v.size();
}